

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry.c
# Opt level: O1

void ui_entry_insert(ui_entry *entry)

{
  wchar_t wVar1;
  long lVar2;
  ui_entry **ppuVar3;
  bool bVar4;
  wchar_t ind;
  wchar_t local_1c;
  
  wVar1 = ui_entry_search(entry->name,&local_1c);
  if (wVar1 != L'\0') {
    quit("Attempted to insert ui_entry with same name");
  }
  ppuVar3 = entries;
  lVar2 = (long)n_entry;
  if (n_entry == nalloc_entry) {
    if (L'\x3fffffff' < nalloc_entry) {
      quit("Too many ui_entry");
    }
    wVar1 = nalloc_entry * 2;
    bVar4 = nalloc_entry != L'\0';
    nalloc_entry = L'\b';
    if (bVar4) {
      nalloc_entry = wVar1;
    }
    ppuVar3 = (ui_entry **)mem_alloc((long)nalloc_entry << 3);
    lVar2 = (long)local_1c;
    if (0 < lVar2) {
      memcpy(ppuVar3,entries,lVar2 * 8);
    }
    ppuVar3[lVar2] = entry;
    if (local_1c < n_entry) {
      memcpy(ppuVar3 + lVar2 + 1,entries + lVar2,(long)(n_entry - local_1c) << 3);
    }
    mem_free(entries);
    entries = ppuVar3;
  }
  else {
    if (local_1c < n_entry) {
      do {
        ppuVar3[lVar2] = ppuVar3[lVar2 + -1];
        lVar2 = lVar2 + -1;
      } while (local_1c < lVar2);
    }
    entries[local_1c] = entry;
  }
  n_entry = n_entry + L'\x01';
  return;
}

Assistant:

static void ui_entry_insert(struct ui_entry *entry)
{
	int ind;

	if (ui_entry_search(entry->name, &ind)) {
		quit("Attempted to insert ui_entry with same name");
	}

	if (n_entry == nalloc_entry) {
		struct ui_entry **extended;

		if (nalloc_entry > INT_MAX / 2) {
			quit("Too many ui_entry");
		}
		nalloc_entry = (nalloc_entry == 0) ? 8 : 2 * nalloc_entry;
		extended = mem_alloc(nalloc_entry * sizeof(*extended));
		if (ind > 0) {
			(void) memcpy(extended, entries,
				ind * sizeof(*entries));
		}
		extended[ind] = entry;
		if (ind < n_entry) {
			(void) memcpy(extended + ind + 1, entries + ind,
				(n_entry - ind) * sizeof(*entries));
		}
		mem_free(entries);
		entries = extended;
	} else {
		int i;

		for (i = n_entry; i > ind; --i) {
			entries[i] = entries[i - 1];
		}
		entries[ind] = entry;
	}
	++n_entry;
}